

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_option(csh ud,cs_opt_type type,size_t value)

{
  uint8_t uVar1;
  cs_opt_mem *mem;
  cs_struct *handle;
  size_t value_local;
  cs_opt_type type_local;
  csh ud_local;
  
  archs_enable();
  if (type == CS_OPT_MEM) {
    cs_mem_malloc = *(cs_malloc_t *)value;
    cs_mem_calloc = *(cs_calloc_t *)(value + 8);
    cs_mem_realloc = *(cs_realloc_t *)(value + 0x10);
    cs_mem_free = *(cs_free_t *)(value + 0x18);
    cs_vsnprintf = *(cs_vsnprintf_t *)(value + 0x20);
    ud_local._4_4_ = CS_ERR_OK;
  }
  else if (ud == 0) {
    ud_local._4_4_ = CS_ERR_CSH;
  }
  else if (type == CS_OPT_DETAIL) {
    *(int *)(ud + 0x68) = (int)value;
    ud_local._4_4_ = CS_ERR_OK;
  }
  else if (type == CS_OPT_SKIPDATA) {
    *(bool *)(ud + 0x88) = value == 3;
    if (((*(byte *)(ud + 0x88) & 1) != 0) && (*(char *)(ud + 0x89) == '\0')) {
      uVar1 = skipdata_size((cs_struct *)ud);
      *(uint8_t *)(ud + 0x89) = uVar1;
    }
    ud_local._4_4_ = CS_ERR_OK;
  }
  else if (type == CS_OPT_SKIPDATA_SETUP) {
    if (value != 0) {
      *(undefined8 *)(ud + 0x90) = *(undefined8 *)value;
      *(undefined8 *)(ud + 0x98) = *(undefined8 *)(value + 8);
      *(undefined8 *)(ud + 0xa0) = *(undefined8 *)(value + 0x10);
    }
    ud_local._4_4_ = CS_ERR_OK;
  }
  else {
    ud_local._4_4_ = (*arch_option[*(uint *)ud])((cs_struct *)ud,type,value);
  }
  return ud_local._4_4_;
}

Assistant:

CAPSTONE_EXPORT
cs_err cs_option(csh ud, cs_opt_type type, size_t value)
{
	struct cs_struct *handle;
	archs_enable();

	// cs_option() can be called with NULL handle just for CS_OPT_MEM
	// This is supposed to be executed before all other APIs (even cs_open())
	if (type == CS_OPT_MEM) {
		cs_opt_mem *mem = (cs_opt_mem *)value;

		cs_mem_malloc = mem->malloc;
		cs_mem_calloc = mem->calloc;
		cs_mem_realloc = mem->realloc;
		cs_mem_free = mem->free;
		cs_vsnprintf = mem->vsnprintf;

		return CS_ERR_OK;
	}

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle)
		return CS_ERR_CSH;

	switch(type) {
		default:
			break;
		case CS_OPT_DETAIL:
			handle->detail = (cs_opt_value)value;
			return CS_ERR_OK;
		case CS_OPT_SKIPDATA:
			handle->skipdata = (value == CS_OPT_ON);
			if (handle->skipdata) {
				if (handle->skipdata_size == 0) {
					// set the default skipdata size
					handle->skipdata_size = skipdata_size(handle);
				}
			}
			return CS_ERR_OK;
		case CS_OPT_SKIPDATA_SETUP:
			if (value)
				handle->skipdata_setup = *((cs_opt_skipdata *)value);
			return CS_ERR_OK;
	}

	return arch_option[handle->arch](handle, type, value);
}